

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O1

int Gia_ManSolveSat(Gia_Man_t *p)

{
  void *pvVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  Aig_Man_t *pMan;
  Vec_Int_t *pVVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  char *format;
  int level;
  Gia_Obj_t *pGVar13;
  
  pMan = Gia_ManToAig(p,0);
  iVar3 = Fra_FraigSat(pMan,10000000,0,0,0,0,1,1,0,0);
  if (iVar3 == 0) {
    pvVar1 = pMan->pData;
    *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
    pVVar4 = p->vCis;
    pGVar13 = (Gia_Obj_t *)(ulong)(uint)pVVar4->nSize;
    if (p->nRegs < pVVar4->nSize) {
      lVar6 = 0;
      do {
        if ((int)pGVar13 <= lVar6) goto LAB_00672500;
        pGVar13 = (Gia_Obj_t *)(long)pVVar4->pArray[lVar6];
        if (((long)pGVar13 < 0) || (p->nObjs <= pVVar4->pArray[lVar6])) goto LAB_006724e1;
        pGVar2 = p->pObjs;
        if (pGVar2 == (Gia_Obj_t *)0x0) break;
        *(ulong *)(pGVar2 + (long)pGVar13) =
             *(ulong *)(pGVar2 + (long)pGVar13) & 0xffffffffbfffffff |
             (ulong)((*(uint *)((long)pvVar1 + lVar6 * 4) & 1) << 0x1e);
        lVar6 = lVar6 + 1;
        pVVar4 = p->vCis;
        pGVar13 = (Gia_Obj_t *)(long)pVVar4->nSize;
      } while (lVar6 < (long)pGVar13 - (long)p->nRegs);
    }
    if (0 < p->nObjs) {
      lVar6 = 0;
      lVar10 = 0;
      do {
        pGVar13 = p->pObjs;
        if (pGVar13 == (Gia_Obj_t *)0x0) break;
        uVar7 = *(ulong *)(&pGVar13->field_0x0 + lVar6);
        if ((uVar7 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar7) {
          *(ulong *)(&pGVar13->field_0x0 + lVar6) =
               uVar7 & 0xffffffff3fffffff |
               (ulong)((((uint)(uVar7 >> 0x3d) ^
                        *(uint *)((long)pGVar13 +
                                 (ulong)((uint)(uVar7 >> 0x1e) & 0x7ffffffc) * -3 + lVar6) >> 0x1e)
                        & ((uint)(uVar7 >> 0x1d) & 7 ^
                          *(uint *)((long)pGVar13 +
                                   (ulong)(uint)((int)(uVar7 & 0x1fffffff) << 2) * -3 + lVar6) >>
                          0x1e) & 1) << 0x1e);
        }
        lVar10 = lVar10 + 1;
        pGVar13 = (Gia_Obj_t *)(long)p->nObjs;
        lVar6 = lVar6 + 0xc;
      } while (lVar10 < (long)pGVar13);
    }
    level = (int)pGVar13;
    pVVar4 = p->vCos;
    uVar5 = pVVar4->nSize;
    uVar7 = (ulong)uVar5;
    uVar9 = uVar5 - p->nRegs;
    uVar11 = (ulong)uVar9;
    if (uVar9 != 0 && p->nRegs <= (int)uVar5) {
      lVar6 = 0;
      do {
        if ((int)uVar7 <= lVar6) goto LAB_00672500;
        level = pVVar4->pArray[lVar6];
        if (((long)level < 0) || (p->nObjs <= level)) goto LAB_006724e1;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar13 = p->pObjs + level;
        uVar5 = (uint)*(ulong *)pGVar13;
        *(ulong *)pGVar13 =
             *(ulong *)pGVar13 & 0xffffffffbfffffff |
             (ulong)((uVar5 * 2 ^ *(uint *)(pGVar13 + -(ulong)(uVar5 & 0x1fffffff))) & 0x40000000);
        lVar6 = lVar6 + 1;
        pVVar4 = p->vCos;
        uVar7 = (ulong)pVVar4->nSize;
        level = p->nRegs;
        uVar11 = uVar7 - (long)level;
      } while (lVar6 < (long)uVar11);
    }
    if ((int)uVar11 < 1) {
      format = (char *)0x0;
    }
    else {
      pcVar12 = (char *)0x0;
      pcVar8 = (char *)(uVar7 & 0xffffffff);
      if ((int)uVar7 < 1) {
        pcVar8 = pcVar12;
      }
      do {
        if (pcVar8 == pcVar12) {
LAB_00672500:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        level = pVVar4->pArray[(long)pcVar12];
        lVar6 = (long)level;
        if ((lVar6 < 0) || (p->nObjs <= level)) {
LAB_006724e1:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        format = pcVar12;
      } while (((p->pObjs != (Gia_Obj_t *)0x0) &&
               (level = level * 3, (p->pObjs[lVar6].field_0x3 & 0x40) != 0)) &&
              (pcVar12 = pcVar12 + 1, format = (char *)(uVar11 & 0xffffffff),
              (char *)(uVar11 & 0xffffffff) != pcVar12));
    }
    if ((int)format != (int)uVar11) {
      Abc_Print(level,format);
    }
  }
  Aig_ManStop(pMan);
  return iVar3;
}

Assistant:

int Gia_ManSolveSat( Gia_Man_t * p )
{
//    extern int Fra_FraigSat( Aig_Man_t * pMan, ABC_INT64_T nConfLimit, ABC_INT64_T nInsLimit, int fFlipBits, int fAndOuts, int fNewSolver, int fVerbose );
    Aig_Man_t * pNew;
    int RetValue;//, clk = Abc_Clock();
    pNew = Gia_ManToAig( p, 0 );
    RetValue = Fra_FraigSat( pNew, 10000000, 0, 0, 0, 0, 1, 1, 0, 0 );
    if ( RetValue == 0 )
    {
        Gia_Obj_t * pObj;
        int i, * pInit = (int *)pNew->pData;
        Gia_ManConst0(p)->fMark0 = 0;
        Gia_ManForEachPi( p, pObj, i )
            pObj->fMark0 = pInit[i];
        Gia_ManForEachAnd( p, pObj, i )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachPo( p, pObj, i )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj));
        Gia_ManForEachPo( p, pObj, i )
            if ( pObj->fMark0 != 1 )
                break;
        if ( i != Gia_ManPoNum(p) )
            Abc_Print( 1, "Counter-example verification has failed.  " );
//        else
//            Abc_Print( 1, "Counter-example verification succeeded.  " );
    }
/*
    else if ( RetValue == 1 )
        Abc_Print( 1, "The SAT problem is unsatisfiable.  " );
    else if ( RetValue == -1 )
        Abc_Print( 1, "The SAT problem is undecided.  " );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
*/
    Aig_ManStop( pNew );
    return RetValue;
}